

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

BOOL LOADCallDllMainSafe(MODSTRUCT *module,DWORD dwReason,LPVOID lpReserved)

{
  int new_level;
  BOOL BVar1;
  
  new_level = DBG_change_entrylevel(0);
  if (PAL_InitializeChakraCoreCalled != false) {
    PAL_Leave(PAL_BoundaryBottom);
    BVar1 = (*module->pDllMain)(module->hinstance,dwReason,lpReserved);
    PAL_Reenter(PAL_BoundaryBottom);
    DBG_change_entrylevel(new_level);
    return BVar1;
  }
  abort();
}

Assistant:

static BOOL LOADCallDllMainSafe(MODSTRUCT *module, DWORD dwReason, LPVOID lpReserved)
{
#if _ENABLE_DEBUG_MESSAGES_
    /* reset ENTRY nesting level back to zero while inside the callback... */
    int old_level = DBG_change_entrylevel(0);
#endif /* _ENABLE_DEBUG_MESSAGES_ */

    struct Param
    {
        MODSTRUCT *module;
        DWORD dwReason;
        LPVOID lpReserved;
        BOOL ret;
    } param;
    param.module = module;
    param.dwReason = dwReason;
    param.lpReserved = lpReserved;
    param.ret = FALSE;

    {
        TRACE("Calling DllMain (%p) for module %S\n",
              param.module->pDllMain,
              param.module->lib_name ? param.module->lib_name : W16_NULLSTRING);

        {
            // This module may be foreign to our PAL, so leave our PAL.
            // If it depends on us, it will re-enter.
            PAL_LeaveHolder holder;
            param.ret = param.module->pDllMain(param.module->hinstance, param.dwReason, param.lpReserved);
        }
    }

#if _ENABLE_DEBUG_MESSAGES_
    /* ...and set nesting level back to what it was */
    DBG_change_entrylevel(old_level);
#endif /* _ENABLE_DEBUG_MESSAGES_ */

    return param.ret;
}